

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_pkey.c
# Opt level: O0

EVP_PKEY * EVP_PKCS82PKEY_ex(PKCS8_PRIV_KEY_INFO *p8,OSSL_LIB_CTX *libctx,char *propq)

{
  int iVar1;
  int iVar2;
  size_t *pdata_len;
  OSSL_DECODER_CTX *file;
  char *in_RDX;
  EVP_PKEY **in_RSI;
  PKCS8_PRIV_KEY_INFO *in_RDI;
  char *unaff_retaddr;
  OSSL_DECODER_CTX *dctx;
  size_t len;
  int selection;
  int encoded_len;
  uchar *encoded_data;
  uchar *p8_data;
  EVP_PKEY *pkey;
  int line;
  undefined4 uVar3;
  OSSL_DECODER_CTX *ctx;
  EVP_PKEY *input_structure;
  
  input_structure = (EVP_PKEY *)0x0;
  ctx = (OSSL_DECODER_CTX *)0x0;
  iVar1 = i2d_PKCS8_PRIV_KEY_INFO(in_RDI,(uchar **)&stack0xffffffffffffffc8);
  if ((0 < iVar1) && (ctx != (OSSL_DECODER_CTX *)0x0)) {
    pdata_len = (size_t *)(long)iVar1;
    uVar3 = 0x87;
    file = OSSL_DECODER_CTX_new_for_pkey
                     (in_RSI,in_RDX,(char *)input_structure,(char *)ctx,(int)((ulong)ctx >> 0x20),
                      (OSSL_LIB_CTX *)CONCAT44(iVar1,0x87),unaff_retaddr);
    line = (int)((ulong)in_RDX >> 0x20);
    if ((file == (OSSL_DECODER_CTX *)0x0) ||
       (iVar2 = OSSL_DECODER_from_data(ctx,(uchar **)CONCAT44(iVar1,uVar3),pdata_len), iVar2 == 0))
    {
      input_structure =
           evp_pkcs82pkey_legacy
                     ((PKCS8_PRIV_KEY_INFO *)p8_data,(OSSL_LIB_CTX *)encoded_data,_selection);
    }
    CRYPTO_clear_free((void *)CONCAT44(iVar1,uVar3),(size_t)pdata_len,(char *)file,line);
    OSSL_DECODER_CTX_free((OSSL_DECODER_CTX *)0x42f6f2);
    return input_structure;
  }
  return (EVP_PKEY *)0x0;
}

Assistant:

EVP_PKEY *EVP_PKCS82PKEY_ex(const PKCS8_PRIV_KEY_INFO *p8, OSSL_LIB_CTX *libctx,
                            const char *propq)
{
    EVP_PKEY *pkey = NULL;
    const unsigned char *p8_data = NULL;
    unsigned char *encoded_data = NULL;
    int encoded_len;
    int selection;
    size_t len;
    OSSL_DECODER_CTX *dctx = NULL;

    if ((encoded_len = i2d_PKCS8_PRIV_KEY_INFO(p8, &encoded_data)) <= 0
            || encoded_data == NULL)
        return NULL;

    p8_data = encoded_data;
    len = encoded_len;
    selection = EVP_PKEY_KEYPAIR | EVP_PKEY_KEY_PARAMETERS;
    dctx = OSSL_DECODER_CTX_new_for_pkey(&pkey, "DER", "PrivateKeyInfo",
                                         NULL, selection, libctx, propq);
    if (dctx == NULL
        || !OSSL_DECODER_from_data(dctx, &p8_data, &len))
        /* try legacy */
        pkey = evp_pkcs82pkey_legacy(p8, libctx, propq);

    OPENSSL_clear_free(encoded_data, encoded_len);
    OSSL_DECODER_CTX_free(dctx);
    return pkey;
}